

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

size_t Assimp::Ogre::VertexElement::ComponentCount(Type type)

{
  size_t sStack_10;
  Type type_local;
  
  switch(type) {
  case VET_FLOAT1:
  case VET_COLOUR:
  case VET_SHORT1:
  case VET_COLOUR_ARGB:
  case VET_COLOUR_ABGR:
  case VET_DOUBLE1:
  case VET_USHORT1:
  case VET_INT1:
  case VET_UINT1:
    sStack_10 = 1;
    break;
  case VET_FLOAT2:
  case VET_SHORT2:
  case VET_DOUBLE2:
  case VET_USHORT2:
  case VET_INT2:
  case VET_UINT2:
    sStack_10 = 2;
    break;
  case VET_FLOAT3:
  case VET_SHORT3:
  case VET_DOUBLE3:
  case VET_USHORT3:
  case VET_INT3:
  case VET_UINT3:
    sStack_10 = 3;
    break;
  case VET_FLOAT4:
  case VET_SHORT4:
  case VET_UBYTE4:
  case VET_DOUBLE4:
  case VET_USHORT4:
  case VET_INT4:
  case VET_UINT4:
    sStack_10 = 4;
    break;
  default:
    sStack_10 = 0;
  }
  return sStack_10;
}

Assistant:

size_t VertexElement::ComponentCount(Type type)
{
    switch(type)
    {
        case VET_COLOUR:
        case VET_COLOUR_ABGR:
        case VET_COLOUR_ARGB:
        case VET_FLOAT1:
        case VET_DOUBLE1:
        case VET_SHORT1:
        case VET_USHORT1:
        case VET_INT1:
        case VET_UINT1:
            return 1;
        case VET_FLOAT2:
        case VET_DOUBLE2:
        case VET_SHORT2:
        case VET_USHORT2:
        case VET_INT2:
        case VET_UINT2:
            return 2;
        case VET_FLOAT3:
        case VET_DOUBLE3:
        case VET_SHORT3:
        case VET_USHORT3:
        case VET_INT3:
        case VET_UINT3:
            return 3;
        case VET_FLOAT4:
        case VET_DOUBLE4:
        case VET_SHORT4:
        case VET_USHORT4:
        case VET_INT4:
        case VET_UINT4:
        case VET_UBYTE4:
            return 4;
    }
    return 0;
}